

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  longlong lVar1;
  float *pfVar2;
  long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImRect *in_RDI;
  longlong in_R8;
  longlong in_R9;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImRect grab_rect;
  ImU32 grab_col;
  ImU32 bg_col;
  float scroll_v_norm;
  bool seek_absolute;
  float clicked_v_norm;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  ImS64 scroll_max;
  bool hovered;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  ImS64 win_size_v;
  float scrollbar_size_v;
  ImRect bb;
  bool allow_interaction;
  ImGuiStyle *style;
  float alpha;
  float bb_frame_height;
  float bb_frame_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  ImGuiCol in_stack_ffffffffffffff04;
  ImGuiCol idx;
  undefined3 uVar9;
  undefined4 in_stack_ffffffffffffff08;
  float fVar10;
  ImGuiID in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char local_ad;
  ImGuiButtonFlags in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  ImGuiID id_00;
  undefined6 in_stack_ffffffffffffff70;
  byte bVar11;
  byte bVar12;
  ImVec2 local_74;
  ImRect local_6c;
  byte local_59;
  ImGuiStyle *local_58;
  float local_4c;
  float local_48;
  float local_44;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  longlong local_30;
  longlong local_28;
  long *local_20;
  int local_18;
  ImGuiID local_14;
  ImRect *local_10;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_38 = GImGui;
  local_40 = GImGui->CurrentWindow;
  if ((local_40->SkipItems & 1U) == 0) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    local_44 = ImRect::GetWidth(in_RDI);
    local_48 = ImRect::GetHeight(local_10);
    if ((local_44 <= 0.0) || (local_48 <= 0.0)) {
      local_1 = false;
    }
    else {
      local_4c = 1.0;
      if ((local_18 == 1) &&
         (fVar3 = (local_38->Style).FramePadding.y, local_48 < fVar3 + fVar3 + local_38->FontSize))
      {
        local_4c = ImSaturate((local_48 - local_38->FontSize) /
                              ((local_38->Style).FramePadding.y * 2.0));
      }
      if (0.0 < local_4c) {
        local_58 = &local_38->Style;
        local_59 = 1.0 <= local_4c;
        local_6c.Min = local_10->Min;
        local_6c.Max = local_10->Max;
        fVar3 = ImClamp<float>((float)(int)((local_44 - 2.0) * 0.5),0.0,3.0);
        fVar3 = -fVar3;
        fVar4 = ImClamp<float>((float)(int)((local_48 - 2.0) * 0.5),0.0,3.0);
        ImVec2::ImVec2(&local_74,fVar3,-fVar4);
        ImRect::Expand(&local_6c,&local_74);
        if (local_18 == 0) {
          fVar4 = ImRect::GetWidth(&local_6c);
        }
        else {
          fVar4 = ImRect::GetHeight(&local_6c);
        }
        fVar10 = fVar4;
        lVar1 = ImMax<long_long>(local_30,local_28);
        lVar1 = ImMax<long_long>(lVar1,1);
        fVar5 = ImClamp<float>(fVar4 * ((float)local_28 / (float)lVar1),local_58->GrabMinSize,fVar4)
        ;
        fVar6 = fVar5 / fVar4;
        bVar12 = 0;
        bVar11 = 0;
        ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                in_stack_ffffffffffffff14,(ImRect *)CONCAT44(fVar10,in_stack_ffffffffffffff08),
                in_stack_ffffffffffffff04);
        ButtonBehavior((ImRect *)CONCAT17(bVar12,CONCAT16(bVar11,in_stack_ffffffffffffff70)),id_00,
                       (bool *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (bool *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff54);
        lVar1 = ImMax<long_long>(1,local_30 - local_28);
        fVar7 = ImSaturate((float)*local_20 / (float)lVar1);
        fVar7 = (fVar7 * (fVar4 - fVar5)) / fVar4;
        if ((((bVar12 & 1) != 0) && ((local_59 & 1) != 0)) && (fVar6 < 1.0)) {
          pfVar2 = ImVec2::operator[](&local_6c.Min,(long)local_18);
          fVar8 = *pfVar2;
          pfVar2 = ImVec2::operator[](&(local_38->IO).MousePos,(long)local_18);
          fVar8 = ImSaturate((*pfVar2 - fVar8) / fVar4);
          SetHoveredID(local_14);
          local_ad = '\0';
          if ((local_38->ActiveIdIsJustActivated & 1U) != 0) {
            uVar9 = (undefined3)in_stack_ffffffffffffff08;
            in_stack_ffffffffffffff08 = CONCAT13(1,uVar9);
            if (fVar7 <= fVar8) {
              in_stack_ffffffffffffff08 = CONCAT13(fVar7 + fVar6 < fVar8,uVar9);
            }
            local_ad = (char)((uint)in_stack_ffffffffffffff08 >> 0x18);
            if (local_ad == '\0') {
              local_38->ScrollbarClickDeltaToGrabCenter = -fVar6 * 0.5 + (fVar8 - fVar7);
            }
            else {
              local_38->ScrollbarClickDeltaToGrabCenter = 0.0;
            }
          }
          fVar7 = ImSaturate((-fVar6 * 0.5 + (fVar8 - local_38->ScrollbarClickDeltaToGrabCenter)) /
                             (1.0 - fVar6));
          *local_20 = (long)(fVar7 * (float)lVar1);
          fVar7 = ImSaturate((float)*local_20 / (float)lVar1);
          fVar7 = (fVar7 * (fVar4 - fVar5)) / fVar4;
          if (local_ad != '\0') {
            local_38->ScrollbarClickDeltaToGrabCenter = -fVar6 * 0.5 + (fVar8 - fVar7);
          }
        }
        GetColorU32(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        if ((bVar12 & 1) == 0) {
          idx = 0xf;
          if ((bVar11 & 1) != 0) {
            idx = 0x10;
          }
        }
        else {
          idx = 0x11;
        }
        GetColorU32(idx,in_stack_ffffffffffffff00);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff14,fVar3),
                   (ImVec2 *)CONCAT44(fVar10,in_stack_ffffffffffffff08),
                   (ImVec2 *)CONCAT44(idx,in_stack_ffffffffffffff00),
                   (ImU32)in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                   (ImDrawFlags)in_stack_fffffffffffffef4);
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        if (local_18 == 0) {
          in_stack_ffffffffffffff00 = ImLerp<float>(local_6c.Min.x,local_6c.Max.x,fVar7);
          in_stack_fffffffffffffefc = local_6c.Min.y;
          ImLerp<float>(local_6c.Min.x,local_6c.Max.x,fVar7);
          ImRect::ImRect((ImRect *)CONCAT44(idx,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                         ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                         in_stack_fffffffffffffef0);
        }
        else {
          in_stack_fffffffffffffef8 = local_6c.Min.x;
          fVar4 = ImLerp<float>(local_6c.Min.y,local_6c.Max.y,fVar7);
          in_stack_fffffffffffffef4 = local_6c.Max.x;
          ImLerp<float>(local_6c.Min.y,local_6c.Max.y,fVar7);
          ImRect::ImRect((ImRect *)CONCAT44(idx,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                         ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,fVar4);
        }
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff14,fVar3),
                   (ImVec2 *)CONCAT44(fVar10,in_stack_ffffffffffffff08),
                   (ImVec2 *)CONCAT44(idx,in_stack_ffffffffffffff00),
                   (ImU32)in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                   (ImDrawFlags)in_stack_fffffffffffffef4);
        local_1 = (bool)(bVar12 & 1);
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}